

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storage.hpp
# Opt level: O2

void __thiscall
benchmarks::StorageArray<std::recursive_mutex>::StorageArray
          (StorageArray<std::recursive_mutex> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  int64_t *piVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x28),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  this->_size = size;
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x28),8) == 0) {
    uVar2 = uVar3;
  }
  piVar4 = (int64_t *)operator_new__(uVar2);
  *piVar4 = size;
  this->_arr = (Storage<std::recursive_mutex> *)(piVar4 + 1);
  return;
}

Assistant:

StorageArray(int64_t size)
			: _size(size)
		{ _arr = new Storage<T_>[size]; }